

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall
djb::tab::tab(tab *this,vector<float,_std::allocator<float>_> *ndf,int zres,int pres)

{
  impl local_28;
  int local_20;
  int local_1c;
  int pres_local;
  int zres_local;
  vector<float,_std::allocator<float>_> *ndf_local;
  tab *this_local;
  
  local_28._vptr_impl = (_func_int **)0x0;
  local_20 = pres;
  local_1c = zres;
  _pres_local = ndf;
  ndf_local = (vector<float,_std::allocator<float>_> *)this;
  fresnel::ideal<1>::ideal((ideal<1> *)&local_28);
  microfacet::microfacet(&this->super_microfacet,&local_28);
  fresnel::ideal<1>::~ideal((ideal<1> *)&local_28);
  (this->super_microfacet).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_0026ad60;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf,_pres_local);
  std::vector<djb::vec2,_std::allocator<djb::vec2>_>::vector(&this->m_cdf);
  this->m_zres = local_1c;
  this->m_pres = local_20;
  configure(this);
  return;
}

Assistant:

tab::tab(const std::vector<float_t> &ndf, int zres, int pres):
	microfacet(fresnel::ideal<1>()), m_ndf(ndf), m_zres(zres), m_pres(pres)
{
	configure();
}